

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  pointer piVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  char cVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  Convolution *pCVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  ulong __n;
  Mat *pMVar24;
  float *pfVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  Option opt_g;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_121;
  Convolution *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_100;
  ulong local_f8;
  int local_ec;
  Mat *local_e8;
  ulong local_e0;
  undefined1 local_d8 [40];
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  long local_90;
  vector<int,_std::allocator<int>_> local_88;
  Mat local_70;
  
  uStack_b0 = local_d8._32_8_;
  local_70.elemsize = bottom_blob->elemsize;
  iVar21 = this->kernel_w;
  iVar18 = this->kernel_h;
  iVar20 = this->dilation_w;
  iVar11 = this->dilation_h;
  local_70.data = bottom_blob->data;
  local_70.refcount = bottom_blob->refcount;
  local_70.elempack = bottom_blob->elempack;
  local_70.allocator = bottom_blob->allocator;
  local_118._0_4_ = bottom_blob->dims;
  local_118._4_4_ = bottom_blob->w;
  uStack_110._0_4_ = bottom_blob->h;
  uStack_110._4_4_ = bottom_blob->c;
  local_70.cstep = bottom_blob->cstep;
  if (local_70.refcount != (int *)0x0) {
    LOCK();
    *local_70.refcount = *local_70.refcount + 1;
    UNLOCK();
  }
  local_120 = this;
  local_70._40_8_ = local_118;
  local_70._48_8_ = uStack_110;
  if (local_70.elemsize != 1) {
    uVar1 = opt->use_int8_arithmetic;
    uVar2 = opt->use_packing_layout;
    uVar3 = opt->use_shader_pack8;
    uVar4 = opt->use_bf16_storage;
    uVar5 = *(undefined4 *)&opt->field_0x24;
    local_d8._36_4_ = uVar5;
    local_d8[0x23] = uVar4;
    local_d8[0x22] = uVar3;
    local_d8[0x21] = uVar2;
    local_d8[0x20] = uVar1;
    local_d8._0_8_ = *(undefined8 *)opt;
    local_d8._16_4_ = *(undefined4 *)&opt->workspace_allocator;
    local_d8._20_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
    local_d8[0x18] = opt->use_winograd_convolution;
    local_d8[0x19] = opt->use_sgemm_convolution;
    local_d8[0x1a] = opt->use_int8_inference;
    local_d8[0x1b] = opt->use_vulkan_compute;
    local_d8[0x1c] = opt->use_fp16_packed;
    local_d8[0x1d] = opt->use_fp16_storage;
    local_d8[0x1e] = opt->use_fp16_arithmetic;
    local_d8[0x1f] = opt->use_int8_storage;
    local_d8._8_4_ = SUB84(opt->workspace_allocator,0);
    local_d8._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    quantize_float32_to_int8(bottom_blob,&local_70,this->bottom_blob_int8_scale,(Option *)local_d8);
  }
  local_d8._16_4_ = 0;
  local_d8._20_4_ = 0;
  local_d8._24_4_ = 0;
  local_d8._0_8_ = (void *)0x0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  make_padding(local_120,&local_70,(Mat *)local_d8,opt);
  pCVar19 = local_120;
  iVar15 = -100;
  if ((void *)local_d8._0_8_ != (void *)0x0) {
    if ((long)(int)local_a8._4_4_ * local_a8._8_8_ != 0) {
      iVar15 = uStack_b0._4_4_;
      uVar6 = (long)(~((iVar21 + -1) * iVar20) + uStack_b0._4_4_) / (long)local_120->stride_w;
      uVar16 = (long)(~((iVar18 + -1) * iVar11) + local_a8._0_4_) / (long)local_120->stride_h;
      __n = (long)local_120->kernel_h * (long)local_120->kernel_w;
      local_e8 = top_blob;
      std::vector<int,_std::allocator<int>_>::vector(&local_88,__n,&local_121);
      piVar9 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar24 = local_e8;
      iVar21 = pCVar19->kernel_h;
      if (0 < iVar21) {
        iVar18 = pCVar19->dilation_h;
        iVar20 = pCVar19->kernel_w;
        iVar11 = pCVar19->dilation_w * iVar20;
        iVar12 = 0;
        iVar14 = 0;
        iVar17 = 0;
        do {
          if (0 < iVar20) {
            lVar22 = 0;
            do {
              local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar17 + lVar22] = iVar14;
              iVar14 = iVar14 + pCVar19->dilation_w;
              iVar20 = pCVar19->kernel_w;
              lVar22 = lVar22 + 1;
            } while ((int)lVar22 < iVar20);
            iVar17 = iVar17 + (int)lVar22;
            iVar21 = pCVar19->kernel_h;
          }
          iVar14 = iVar14 + (iVar15 * iVar18 - iVar11);
          iVar12 = iVar12 + 1;
        } while (iVar12 < iVar21);
      }
      local_100 = uVar16 & 0xffffffff;
      local_e0 = uVar6 & 0xffffffff;
      Mat::create(local_e8,(int)uVar6 + 1,(int)uVar16 + 1,pCVar19->num_output,
                  ((ulong)pCVar19->use_int8_requantize ^ 1) * 3 + 1,opt->blob_allocator);
      iVar15 = -100;
      if ((pMVar24->data != (void *)0x0) && ((long)pMVar24->c * pMVar24->cstep != 0)) {
        iVar21 = local_120->num_output;
        if (0 < iVar21) {
          uVar8 = local_118._4_4_;
          uVar6 = (ulong)local_118._4_4_;
          local_ec = (int)__n * local_118._4_4_;
          local_118 = 0;
          uVar16 = local_100;
          pCVar19 = local_120;
          do {
            if (-1 < (int)uVar16) {
              pfVar25 = (float *)(pMVar24->cstep * local_118 * pMVar24->elemsize +
                                 (long)pMVar24->data);
              local_90 = (long)(local_ec * (int)local_118);
              local_f8 = 0;
              do {
                if (-1 < (int)local_e0) {
                  iVar21 = 0;
                  do {
                    if ((int)uVar8 < 1) {
                      fVar27 = 0.0;
                    }
                    else {
                      lVar22 = (long)(pCVar19->weight_data).data + local_90;
                      uVar16 = 0;
                      iVar18 = 0;
                      do {
                        if (0 < (int)__n) {
                          uVar23 = 0;
                          do {
                            iVar18 = iVar18 + (int)*(char *)(lVar22 + uVar23) *
                                              (int)*(char *)(local_d8._0_8_ +
                                                            (long)piVar9[uVar23] +
                                                            local_a8._8_8_ *
                                                            CONCAT44(local_d8._20_4_,local_d8._16_4_
                                                                    ) * uVar16 +
                                                            (long)iVar21 * (long)pCVar19->stride_w +
                                                            (long)(uStack_b0._4_4_ * (int)local_f8 *
                                                                  pCVar19->stride_h) *
                                                            CONCAT44(local_d8._20_4_,local_d8._16_4_
                                                                    ));
                            uVar23 = uVar23 + 1;
                          } while ((__n & 0xffffffff) != uVar23);
                        }
                        lVar22 = lVar22 + __n;
                        uVar16 = uVar16 + 1;
                      } while (uVar16 != uVar6);
                      fVar27 = (float)iVar18;
                      pCVar19 = local_120;
                    }
                    fVar28 = *(float *)((long)(pCVar19->weight_data_int8_scales).data +
                                       local_118 * 4);
                    fVar27 = (float)(~-(uint)(fVar28 == 0.0) &
                                    (uint)(1.0 / (pCVar19->bottom_blob_int8_scale * fVar28))) *
                             fVar27;
                    if (pCVar19->use_int8_requantize == false) {
                      if (pCVar19->bias_term != 0) {
                        fVar27 = fVar27 + *(float *)((long)(pCVar19->bias_data).data + local_118 * 4
                                                    );
                      }
                      fVar28 = 0.0;
                      if (0.0 <= fVar27) {
                        fVar28 = fVar27;
                      }
                      if (pCVar19->activation_type != 1) {
                        fVar28 = fVar27;
                      }
                      *pfVar25 = fVar28;
                      lVar22 = 4;
                    }
                    else {
                      if (pCVar19->bias_term != 0) {
                        fVar27 = fVar27 + *(float *)((long)(pCVar19->bias_data).data + local_118 * 4
                                                    );
                      }
                      fVar27 = roundf(fVar27 * pCVar19->top_blob_int8_scale);
                      iVar18 = (int)fVar27;
                      if (iVar18 < -0x7e) {
                        iVar18 = -0x7f;
                      }
                      if (0x7e < iVar18) {
                        iVar18 = 0x7f;
                      }
                      cVar10 = (char)iVar18;
                      cVar13 = '\0';
                      if ('\0' < cVar10) {
                        cVar13 = cVar10;
                      }
                      if (local_120->activation_type != 1) {
                        cVar13 = cVar10;
                      }
                      *(char *)pfVar25 = cVar13;
                      lVar22 = 1;
                      pCVar19 = local_120;
                    }
                    pfVar25 = (float *)((long)pfVar25 + lVar22);
                    bVar26 = iVar21 != (int)local_e0;
                    iVar21 = iVar21 + 1;
                  } while (bVar26);
                }
                iVar21 = (int)local_f8;
                local_f8 = (ulong)(iVar21 + 1);
              } while (iVar21 != (int)local_100);
              iVar21 = pCVar19->num_output;
              uVar16 = local_100;
              pMVar24 = local_e8;
            }
            local_118 = local_118 + 1;
          } while (local_118 < iVar21);
        }
        iVar15 = 0;
      }
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  piVar7 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if ((Allocator *)local_d8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_d8._0_8_ != (void *)0x0) {
          free((void *)local_d8._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_d8._32_8_ + 0x18))();
      }
    }
  }
  if (local_70.refcount != (int *)0x0) {
    LOCK();
    *local_70.refcount = *local_70.refcount + -1;
    UNLOCK();
    if (*local_70.refcount == 0) {
      if (local_70.allocator == (Allocator *)0x0) {
        if (local_70.data != (void *)0x0) {
          free(local_70.data);
        }
      }
      else {
        (**(code **)(*(long *)local_70.allocator + 0x18))();
      }
    }
  }
  return iVar15;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  ksize=%d %d  stride=%d %d\n", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scale, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[ space_ofs[k] ];
                        int w = kptr[k];
                        sum += val * w;
                    }

                    kptr += maxk;
                }

                if (use_int8_requantize)
                {
                    // requantize and relu
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[p];

                    float scale_out = top_blob_int8_scale;//FIXME load param

                    signed char sums8 = float2int8(sumfp32 * scale_out);

                    if (activation_type == 1)
                    {
                        sums8 = std::max(sums8, (signed char)0);
                    }

                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize and relu
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                    float sumfp32 = sum * scale_in;
                    if (bias_term)
                        sumfp32 += bias_data[p];

                    if (activation_type == 1)
                    {
                        sumfp32 = std::max(sumfp32, 0.f);
                    }

                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}